

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::SetKeyAndValue
          (BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *key,
          double *value)

{
  unordered_map<std::vector<int,_std::allocator<int>_>,_unsigned_long,_cimod::vector_hash,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>_>
  *this_00;
  PolynomialValueList<double> *this_01;
  double dVar1;
  pointer pdVar2;
  iterator __position;
  pointer pdVar3;
  pointer piVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  int *index;
  pointer __k;
  double dVar8;
  
  this_00 = &this->poly_key_inv_;
  cVar5 = std::
          _Hashtable<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,key);
  this_01 = &this->poly_value_list_;
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pdVar3 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar6 = std::__detail::
             _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,key);
    *pmVar6 = (long)pdVar3 - (long)pdVar2 >> 3;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->poly_key_list_,key);
    __position._M_current =
         (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)this_01,__position,value);
    }
    else {
      *__position._M_current = *value;
      (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    pmVar6 = std::__detail::
             _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,key);
    dVar1 = *value;
    dVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[*pmVar6] + dVar1;
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      RemoveInteraction(this,key);
      return;
    }
    pmVar6 = std::__detail::
             _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,key);
    pdVar3 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[*pmVar6] = dVar1 + pdVar3[*pmVar6];
  }
  __k = (key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  piVar4 = (key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (__k != piVar4) {
    do {
      pmVar7 = std::__detail::
               _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->each_variable_num_,__k);
      *pmVar7 = *pmVar7 + 1;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<int_const&>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this,__k);
      this->relabel_flag_for_variables_to_integers_ = true;
      __k = __k + 1;
    } while (__k != piVar4);
  }
  return;
}

Assistant:

void SetKeyAndValue( const std::vector<IndexType> &key, const FloatType &value ) {
      // key is assumed to be sorted
      if ( poly_key_inv_.count( key ) == 0 ) {
        poly_key_inv_[ key ] = poly_value_list_.size();
        poly_key_list_.push_back( key );
        poly_value_list_.push_back( value );
      } else {
        if ( poly_value_list_[ poly_key_inv_[ key ] ] + value == 0.0 ) {
          RemoveInteraction( key );
          return;
        }
        poly_value_list_[ poly_key_inv_[ key ] ] += value;
      }
      for ( const auto &index : key ) {
        each_variable_num_[ index ]++;
        variables_.emplace( index );
        relabel_flag_for_variables_to_integers_ = true;
      }
    }